

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DialogBox.cpp
# Opt level: O3

void __thiscall gui::DialogBox::handleKeyPressed(DialogBox *this)

{
  KeyEvent *in_RSI;
  
  handleKeyPressed((DialogBox *)
                   &this[-1].optionButtons_.
                    super__Vector_base<std::shared_ptr<gui::Button>,_std::allocator<std::shared_ptr<gui::Button>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,in_RSI);
  return;
}

Assistant:

bool DialogBox::handleKeyPressed(const sf::Event::KeyEvent& key) {
    bool eventConsumed = baseClass::handleKeyPressed(key);
    if (key.code == sf::Keyboard::Enter) {
        const auto& submitButton = getSubmitButton();
        if (submitButton != nullptr) {
            submitButton->onClick.emit(submitButton.get(), sf::Vector2f(0.0f, 0.0f));
        }
    } else if (key.code == sf::Keyboard::Escape) {
        const auto& cancelButton = getCancelButton();
        if (cancelButton != nullptr) {
            cancelButton->onClick.emit(cancelButton.get(), sf::Vector2f(0.0f, 0.0f));
        }
        return eventConsumed;    // Do not consume escape event.
    } else if (key.code == sf::Keyboard::Tab) {
        focusNextTextBox();
    } else {
        return eventConsumed;
    }
    return true;
}